

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O1

void __thiscall CILPSolver::Sample2(CILPSolver *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dObj;
  double dCoeff [10];
  int iCoeffIndex [10];
  double local_b0;
  double local_a8 [10];
  int local_58 [10];
  
  Create(this,(char *)0x0);
  iVar1 = AddVariable(this,"X11",2.0,1,0.0,1,1.0);
  iVar2 = AddVariable(this,"X12",3.0,1,0.0,1,1.0);
  iVar3 = AddVariable(this,"X13",3.0,1,0.0,1,1.0);
  iVar4 = AddVariable(this,"X21",2.0,1,0.0,1,1.0);
  iVar5 = AddVariable(this,"X22",3.0,1,0.0,1,1.0);
  iVar6 = AddVariable(this,"X23",3.0,1,0.0,1,1.0);
  iVar7 = AddVariable(this,"X31",2.0,1,0.0,1,1.0);
  AddVariable(this,"X32",2.0,1,0.0,1,1.0);
  local_58[1] = 1;
  local_58[2] = 2;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_58[3] = 3;
  local_a8[3] = 1.0;
  AddConstraint(this,"X1",local_58,local_a8,3,1,1.0,1,1.0);
  local_58[1] = 4;
  local_58[2] = 5;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_58[3] = 6;
  local_a8[3] = 1.0;
  AddConstraint(this,"X2",local_58,local_a8,3,1,1.0,1,1.0);
  local_58[1] = 7;
  local_58[2] = 8;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  AddConstraint(this,"X3",local_58,local_a8,2,1,1.0,1,1.0);
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 6;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_a8[3] = 1.0;
  local_a8[4] = 1.0;
  local_58[5] = 7;
  local_a8[5] = 1.0;
  AddConstraint(this,"p",local_58,local_a8,5,1,0.0,1,2.0);
  local_58[1] = 1;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_a8[3] = 1.0;
  local_a8[4] = 1.0;
  local_58[5] = 6;
  local_a8[5] = 1.0;
  AddConstraint(this,"q",local_58,local_a8,5,1,0.0,1,2.0);
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_a8[3] = 1.0;
  local_a8[4] = 1.0;
  local_58[5] = 8;
  local_a8[5] = 1.0;
  AddConstraint(this,"r",local_58,local_a8,5,1,0.0,1,2.0);
  local_58[1] = 1;
  local_58[2] = 2;
  local_58[3] = 5;
  local_58[4] = 6;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_a8[3] = 1.0;
  local_a8[4] = 1.0;
  local_58[5] = 8;
  local_a8[5] = 1.0;
  AddConstraint(this,"s",local_58,local_a8,5,1,0.0,1,2.0);
  local_b0 = 0.0;
  Solve(this,0x1100000,&local_b0,local_a8);
  printf("Z = %f\nX11:%f, X12:%f, X13:%f\nX21:%f, X22:%f, X23:%f\nX31:%f, X32:%f\n",
         SUB84(local_b0,0),local_a8[iVar1],local_a8[iVar2],local_a8[iVar3],local_a8[iVar4],
         local_a8[iVar5],local_a8[iVar6],local_a8[iVar7]);
  return;
}

Assistant:

void CILPSolver::Sample2()
{
	Create(); 
	
	int	iX11	=	AddVariable("X11",2,1,0,1,1);	
	int	iX12	=	AddVariable("X12",3,1,0,1,1);		
	int	iX13	=	AddVariable("X13",3,1,0,1,1);		

	int	iX21	=	AddVariable("X21",2,1,0,1,1);	
	int	iX22	=	AddVariable("X22",3,1,0,1,1);		
	int	iX23	=	AddVariable("X23",3,1,0,1,1);		
	
	int	iX31	=	AddVariable("X31",2,1,0,1,1);	
	int	iX32	=	AddVariable("X32",2,1,0,1,1);		

	double	dCoeff[10];
	int		iCoeffIndex[10];
	int		iIndex;
	
	iIndex				=	1;
	iCoeffIndex[iIndex]	=	1;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	2;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	3;		dCoeff[iIndex++]	=	1;
	
	int	iX1	=	AddConstraint("X1",iCoeffIndex,dCoeff,iIndex-1,1,1,1,1);	
	
	iIndex				=	1;
	iCoeffIndex[iIndex]	=	4;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	5;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	6;		dCoeff[iIndex++]	=	1;

	int	iX2	=	AddConstraint("X2",iCoeffIndex,dCoeff,iIndex-1,1,1,1,1);	
	
	iIndex				=	1;
	iCoeffIndex[iIndex]	=	7;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	8;		dCoeff[iIndex++]	=	1;
	
	int iX3	=	AddConstraint("X3",iCoeffIndex,dCoeff,iIndex-1,1,1,1,1);	

	iIndex				=	1;
	iCoeffIndex[iIndex]	=	2;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	3;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	4;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	6;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	7;		dCoeff[iIndex++]	=	1;

	AddConstraint("p",iCoeffIndex,dCoeff,iIndex-1,1,0,1,2);	

	iIndex				=	1;
	iCoeffIndex[iIndex]	=	1;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	3;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	4;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	5;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	6;		dCoeff[iIndex++]	=	1;

	AddConstraint("q",iCoeffIndex,dCoeff,iIndex-1,1,0,1,2);	

	iIndex				=	1;
	iCoeffIndex[iIndex]	=	2;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	3;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	4;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	5;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	8;		dCoeff[iIndex++]	=	1;

	AddConstraint("r",iCoeffIndex,dCoeff,iIndex-1,1,0,1,2);	
	
	iIndex				=	1;
	iCoeffIndex[iIndex]	=	1;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	2;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	5;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	6;		dCoeff[iIndex++]	=	1;
	iCoeffIndex[iIndex]	=	8;		dCoeff[iIndex++]	=	1;

	AddConstraint("s",iCoeffIndex,dCoeff,iIndex-1,1,0,1,2);	
	
	double	dObj	=	0;
	Solve(SOL_OPTION_MIP|SOL_OPTION_MAX,&dObj,dCoeff);
	
	printf("Z = %f\nX11:%f, X12:%f, X13:%f\nX21:%f, X22:%f, X23:%f\nX31:%f, X32:%f\n"
													,dObj
													,dCoeff[iX11],dCoeff[iX12],dCoeff[iX13]
													,dCoeff[iX21],dCoeff[iX22],dCoeff[iX23]
													,dCoeff[iX31],dCoeff[iX32]);
}